

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Statement * routineStatement(Statement *__return_storage_ptr__,Compiler *compiler)

{
  Token t;
  Token t_00;
  Token t_01;
  TokenList *pTVar1;
  char *pcVar2;
  char **__ptr;
  Statement *pSVar3;
  undefined4 uVar4;
  uint uVar6;
  undefined8 unaff_R13;
  undefined7 uVar8;
  ulong uVar7;
  long lVar9;
  Block BVar10;
  undefined1 in_stack_ffffffffffffff58 [12];
  undefined4 in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  Token local_90;
  Token local_70;
  Token local_50;
  long lVar5;
  
  __return_storage_ptr__->type = STATEMENT_ROUTINE;
  pTVar1 = head;
  (__return_storage_ptr__->field_1).blockStatement.numStatements = (head->value).line;
  *(undefined4 *)&(__return_storage_ptr__->field_1).breakStatement.pos.file = 0;
  (__return_storage_ptr__->field_1).routine.arguments = (char **)0x0;
  (__return_storage_ptr__->field_1).routine.isNative = 0;
  uVar8 = (undefined7)((ulong)unaff_R13 >> 8);
  if (0 < compiler->indentLevel) {
    printf("\x1b[31m\n[Error] [Line:%d] Routines can only be declared in top level indent!\x1b[0m");
    he = he + 1;
    pTVar1 = head;
    if (head == (TokenList *)0x0) {
      uVar7 = CONCAT71(uVar8,1);
      goto LAB_00102bd2;
    }
  }
  uVar7 = CONCAT71(uVar8,1);
  if ((pTVar1->value).type == TOKEN_FOREIGN) {
    if (pTVar1->next != (TokenList *)0x0) {
      head = pTVar1->next;
    }
    (__return_storage_ptr__->field_1).routine.isNative = 1;
    uVar7 = 0;
  }
LAB_00102bd2:
  consume(&local_50,TOKEN_IDENTIFIER,"Expected routine name!");
  t._8_12_ = in_stack_ffffffffffffff58;
  t.type = local_50.length;
  t._4_4_ = local_50.line;
  t.file._4_4_ = in_stack_ffffffffffffff64;
  t.length = (int)in_stack_ffffffffffffff68;
  t.line = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  pcVar2 = stringOf(t);
  (__return_storage_ptr__->field_1).routine.name = pcVar2;
  consume(&local_90,TOKEN_LEFT_PAREN,"Expected \'(\' after routine declaration!");
  if ((head == (TokenList *)0x0) || ((head->value).type != TOKEN_RIGHT_PAREN)) {
    __ptr = (char **)malloc(8);
    consume(&local_70,TOKEN_IDENTIFIER,"Expected identifer as argument!");
    t_00._8_12_ = in_stack_ffffffffffffff58;
    t_00.type = local_70.length;
    t_00._4_4_ = local_70.line;
    t_00.file._4_4_ = in_stack_ffffffffffffff64;
    t_00.length = (int)in_stack_ffffffffffffff68;
    t_00.line = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
    pcVar2 = stringOf(t_00);
    *__ptr = pcVar2;
    if (head == (TokenList *)0x0) {
      uVar4 = 1;
    }
    else {
      uVar6 = (uint)uVar7;
      lVar9 = 1;
      do {
        lVar5 = lVar9;
        if ((head->value).type != TOKEN_COMMA) break;
        if (head->next != (TokenList *)0x0) {
          head = head->next;
        }
        lVar5 = lVar9 + 1;
        __ptr = (char **)realloc(__ptr,lVar9 * 8 + 8);
        consume(&local_70,TOKEN_IDENTIFIER,"Expected identifer as argument!");
        t_01._8_12_ = in_stack_ffffffffffffff58;
        t_01.type = local_70.length;
        t_01._4_4_ = local_70.line;
        t_01.file._4_4_ = uVar6;
        t_01._24_8_ = compiler;
        pcVar2 = stringOf(t_01);
        __ptr[lVar9] = pcVar2;
        lVar9 = lVar5;
      } while (head != (TokenList *)0x0);
      uVar4 = (undefined4)lVar5;
      uVar7 = (ulong)uVar6;
    }
    *(undefined4 *)&(__return_storage_ptr__->field_1).breakStatement.pos.file = uVar4;
    (__return_storage_ptr__->field_1).routine.arguments = __ptr;
    consume(&local_90,TOKEN_RIGHT_PAREN,"Expected \')\' after argument declaration!");
  }
  else if (head->next != (TokenList *)0x0) {
    head = head->next;
  }
  pSVar3 = (Statement *)
           consume(&local_90,TOKEN_NEWLINE,"Expected newline after routine declaration!");
  if ((char)uVar7 != '\0') {
    BVar10 = blockStatement(compiler,BLOCK_FUNC);
    *(Block *)&(__return_storage_ptr__->field_1).ifStatement.elseBranch.statements = BVar10;
    consume(&local_90,TOKEN_ENDROUTINE,"Expected EndRoutine after routine definition!");
    pSVar3 = (Statement *)
             consume(&local_90,TOKEN_NEWLINE,"Expected newline after routine definition!");
  }
  return pSVar3;
}

Assistant:

static Statement routineStatement(Compiler *compiler){
    Statement s;
    s.type = STATEMENT_ROUTINE;
    s.routine.line = presentLine();
    s.routine.arity = 0;
    s.routine.arguments = NULL;   
    s.routine.name = NULL;
    s.routine.isNative = 0;

    if(compiler->indentLevel > 0){
        printf(line_error("Routines can only be declared in top level indent!"), presentLine());
        he++;
    }

    if(match(TOKEN_FOREIGN))
        s.routine.isNative = 1;
    
    s.routine.name = stringOf(consume(TOKEN_IDENTIFIER, "Expected routine name!"));
    consume(TOKEN_LEFT_PAREN, "Expected '(' after routine declaration!");
    if(peek() != TOKEN_RIGHT_PAREN){
        do{
            s.routine.arity++;
            s.routine.arguments = (char **)reallocate(s.routine.arguments, sizeof(char *) * s.routine.arity);
            s.routine.arguments[s.routine.arity - 1] = stringOf(consume(TOKEN_IDENTIFIER, "Expected identifer as argument!"));
        } while(match(TOKEN_COMMA));
        consume(TOKEN_RIGHT_PAREN, "Expected ')' after argument declaration!");
    }
    else
        advance();
    consume(TOKEN_NEWLINE, "Expected newline after routine declaration!");

    if(s.routine.isNative == 0){
        s.routine.code = blockStatement(compiler, BLOCK_FUNC);

        consume(TOKEN_ENDROUTINE, "Expected EndRoutine after routine definition!");
        consume(TOKEN_NEWLINE, "Expected newline after routine definition!");
    }
    return s;
}